

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

pointer gmlc::networking::TcpServer::create
                  (io_context *io_context,string *address,string *port,bool reuse_port,
                  int nominalBufferSize)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  undefined1 in_R8B;
  undefined4 in_R9D;
  pointer pVar1;
  bool reuse_port_00;
  string *port_00;
  string *address_00;
  io_context *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar2;
  
  uVar2 = CONCAT13(in_R8B,in_stack_ffffffffffffffdc) & 0x1ffffff;
  reuse_port_00 = false;
  port_00 = (string *)0x0;
  address_00 = (string *)0x0;
  SocketFactory::SocketFactory((SocketFactory *)in_RDI);
  create((SocketFactory *)CONCAT44(uVar2,in_R9D),in_stack_ffffffffffffffd0,address_00,port_00,
         reuse_port_00,in_ESI);
  SocketFactory::~SocketFactory((SocketFactory *)0x7e5e92);
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (pointer)pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpServer::pointer TcpServer::create(
    asio::io_context& io_context,
    const std::string& address,
    const std::string& port,
    bool reuse_port,
    int nominalBufferSize)
{
    return TcpServer::create(
        SocketFactory(),
        io_context,
        address,
        port,
        reuse_port,
        nominalBufferSize);
}